

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::setPlotVariables(PeleLM *this)

{
  ostream *poVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string name;
  
  amrex::AmrLevel::setPlotVariables((AmrLevel *)this);
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>(&names);
  lVar4 = 0;
  for (lVar2 = 0;
      lVar2 < (long)names.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)names.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5; lVar2 = lVar2 + 1) {
    std::operator+(&local_1d8,"rho.Y(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((names.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4))
    ;
    std::operator+(&name,&local_1d8,")");
    std::__cxx11::string::~string((string *)&local_1d8);
    amrex::Amr::deleteStatePlotVar(&name);
    std::__cxx11::string::~string((string *)&name);
    lVar4 = lVar4 + 0x20;
  }
  if (NavierStokesBase::verbose != 0) {
    poVar1 = amrex::OutStream();
    amrex::Print::Print((Print *)&name,poVar1);
    std::operator<<((ostream *)name.field_2._M_local_buf,"\nState Plot Vars: ");
    amrex::Print::~Print((Print *)&name);
    puVar3 = &amrex::Amr::state_plot_vars_abi_cxx11_;
    while (puVar3 = (undefined8 *)*puVar3, puVar3 != &amrex::Amr::state_plot_vars_abi_cxx11_) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print((Print *)&name,poVar1);
      std::operator<<((ostream *)name.field_2._M_local_buf,(string *)(puVar3 + 2));
      std::operator<<((ostream *)name.field_2._M_local_buf,' ');
      amrex::Print::~Print((Print *)&name);
    }
    poVar1 = amrex::OutStream();
    amrex::Print::Print((Print *)&name,poVar1);
    std::operator<<((ostream *)name.field_2._M_local_buf,'\n');
    amrex::Print::~Print((Print *)&name);
    poVar1 = amrex::OutStream();
    amrex::Print::Print((Print *)&name,poVar1);
    std::operator<<((ostream *)name.field_2._M_local_buf,"\nDerive Plot Vars: ");
    amrex::Print::~Print((Print *)&name);
    puVar3 = &amrex::Amr::derive_plot_vars_abi_cxx11_;
    while (puVar3 = (undefined8 *)*puVar3, puVar3 != &amrex::Amr::derive_plot_vars_abi_cxx11_) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print((Print *)&name,poVar1);
      std::operator<<((ostream *)name.field_2._M_local_buf,(string *)(puVar3 + 2));
      std::operator<<((ostream *)name.field_2._M_local_buf,' ');
      amrex::Print::~Print((Print *)&name);
    }
    poVar1 = amrex::OutStream();
    amrex::Print::Print((Print *)&name,poVar1);
    std::operator<<((ostream *)name.field_2._M_local_buf,'\n');
    amrex::Print::~Print((Print *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return;
}

Assistant:

void
PeleLM::setPlotVariables ()
{
  AmrLevel::setPlotVariables();

  Vector<std::string> names;
  pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);


// Here we specify to not plot all the rho.Y from the state variables
// because it takes a lot of space in memory and disk usage
// To plot rho.Y, we pass into a derive function (see PeleLM_setup.cpp)
// and it can be activated with "amr.derive_plot_vars=rhoY" in the input file
  for (long int i = 0; i < names.size(); i++)
  {
    const std::string name = "rho.Y("+names[i]+")";
    parent->deleteStatePlotVar(name);
  }

  if (verbose)
  {
    amrex::Print() << "\nState Plot Vars: ";

    std::list<std::string>::const_iterator li =
      parent->statePlotVars().begin(), end = parent->statePlotVars().end();

    for ( ; li != end; ++li)
      amrex::Print() << *li << ' ';
    amrex::Print() << '\n';

    amrex::Print() << "\nDerive Plot Vars: ";

    li  = parent->derivePlotVars().begin();
    end = parent->derivePlotVars().end();

    for ( ; li != end; ++li)
      amrex::Print() << *li << ' ';
    amrex::Print() << '\n';
  }
}